

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::Assembler::setOffset(Assembler *this,size_t offset)

{
  uint8_t *puVar1;
  ulong uVar2;
  Error EVar3;
  ulong uVar4;
  ulong uVar5;
  
  EVar3 = (this->super_CodeEmitter)._lastError;
  if (EVar3 != 0) {
    return EVar3;
  }
  puVar1 = this->_bufferData;
  uVar2 = (this->_section->_buffer)._length;
  uVar4 = (long)this->_bufferPtr - (long)puVar1;
  uVar5 = uVar4;
  if (uVar4 < uVar2) {
    uVar5 = uVar2;
  }
  if (offset <= uVar5) {
    if (uVar2 < uVar4) {
      (this->_section->_buffer)._length = uVar5;
    }
    this->_bufferPtr = puVar1 + offset;
    return 0;
  }
  EVar3 = CodeEmitter::setLastError(&this->super_CodeEmitter,3,(char *)0x0);
  return EVar3;
}

Assistant:

Error Assembler::setOffset(size_t offset) {
  if (_lastError) return _lastError;

  size_t length = std::max(_section->getBuffer().getLength(), getOffset());
  if (ASMJIT_UNLIKELY(offset > length))
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  // If the `Assembler` generated any code the `_bufferPtr` may be higher than
  // the section length stored in `CodeHolder` as it doesn't update it each
  // time it generates machine code. This is the same as calling `sync()`.
  if (_section->_buffer._length < length)
    _section->_buffer._length = length;

  _bufferPtr = _bufferData + offset;
  return kErrorOk;
}